

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::normalizePosition(AbstractScrollAreaPrivate *this)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if ((this->topLeftCorner).xp < 0) {
    (this->topLeftCorner).xp = 0;
  }
  if ((this->topLeftCorner).yp < 0) {
    (this->topLeftCorner).yp = 0;
  }
  lVar2 = *(long *)(this->viewport + 0x20);
  iVar7 = (*(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14)) + 1;
  iVar3 = (*(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18)) + 1;
  iVar5 = (this->scrolledAreaSize).wd;
  iVar1 = (this->scrolledAreaSize).ht;
  iVar6 = iVar5 - iVar7;
  iVar4 = 0;
  if ((iVar6 == 0 || iVar5 < iVar7) || (iVar4 = iVar6, iVar6 < (this->topLeftCorner).xp)) {
    (this->topLeftCorner).xp = iVar4;
  }
  iVar5 = 0;
  if ((iVar1 <= iVar3) || (iVar5 = iVar1 - iVar3, iVar5 < (this->topLeftCorner).yp)) {
    (this->topLeftCorner).yp = iVar5;
  }
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::normalizePosition()
{
	if( topLeftCorner.x() < 0 )
		topLeftCorner.setX( 0 );

	if( topLeftCorner.y() < 0 )
		topLeftCorner.setY( 0 );

	const QSize s = viewport->size();

	const QPoint maxPos = QPoint( scrolledAreaSize.width() - s.width(),
		scrolledAreaSize.height() - s.height() );

	if( scrolledAreaSize.width() > s.width() )
	{
		if( maxPos.x() < topLeftCorner.x() )
			topLeftCorner.setX( maxPos.x() );
	}
	else
		topLeftCorner.setX( 0 );

	if( scrolledAreaSize.height() > s.height() )
	{
		if( maxPos.y() < topLeftCorner.y() )
			topLeftCorner.setY( maxPos.y() );
	}
	else
		topLeftCorner.setY( 0 );
}